

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCase::iterate
          (ComputeShaderGeneratedCase *this)

{
  int *value;
  pointer *ppVVar1;
  bool bVar2;
  bool bVar3;
  RenderContext *context;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  pointer puVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  deUint32 dVar12;
  int iVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  RenderTarget *pRVar16;
  undefined4 extraout_var;
  MessageBuilder *pMVar17;
  undefined4 extraout_var_00;
  pointer pDVar18;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
  *__dest;
  pointer __p;
  pointer pDVar19;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
  *__dest_00;
  long lVar20;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
  *p_Var21;
  size_t __n;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  int drawCmdNdx;
  int iVar22;
  char *pcVar23;
  size_t sVar24;
  pointer pVVar25;
  int x;
  float fVar26;
  int iVar27;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
  *p_Var28;
  char *pcVar29;
  int iVar30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar31;
  uint uVar32;
  int iVar33;
  int iVar34;
  pointer *ppDVar35;
  undefined1 *puVar36;
  pointer __p_00;
  float fVar37;
  undefined8 in_XMM2_Qa;
  undefined8 uVar38;
  undefined1 in_XMM3 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar43;
  float fVar49;
  undefined1 in_XMM4 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar50;
  float fVar51;
  allocator_type local_245;
  float local_244;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
  *local_240;
  int local_234;
  long local_230;
  deUint32 vaoID;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  size_t local_210;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer_2;
  Surface surface;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> buffer;
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar11 = pRVar16->m_width;
  if (0x3ff < iVar11) {
    iVar11 = 0x400;
  }
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar33 = 0x400;
  if (pRVar16->m_height < 0x400) {
    iVar33 = pRVar16->m_height;
  }
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  tcu::Surface::Surface(&surface,iVar11,iVar33);
  buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppVVar1 = &buffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar1);
  std::operator<<((ostream *)ppVVar1,"Preparing to draw ");
  value = &this->m_gridSize;
  pMVar17 = tcu::MessageBuilder::operator<<((MessageBuilder *)&buffer,value);
  std::operator<<(&(pMVar17->m_str).super_basic_ostream<char,_std::char_traits<char>_>," x ");
  pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,value);
  std::operator<<(&(pMVar17->m_str).super_basic_ostream<char,_std::char_traits<char>_>," grid.");
  tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar1);
  if (this->m_computeCmd == false) {
    buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppVVar1 = &buffer.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar1);
    std::operator<<((ostream *)ppVVar1,"Uploading draw command buffer.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar1);
    iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar20 = CONCAT44(extraout_var_00,iVar11);
    iVar11 = this->m_numDrawCmds;
    iVar33 = (this->m_gridSize * this->m_gridSize * 2) / iVar11;
    local_210 = 0x7ffffffffffffff0;
    if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
      buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_244 = (float)(iVar33 * 3);
      p_Var21 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
                 *)0x0;
      local_210 = 0x7ffffffffffffff8;
      p_Var28 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
                 *)0x0;
      __dest_00 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
                   *)0x0;
      local_230 = lVar20;
      fVar26 = local_244;
      for (iVar33 = 0;
          pVVar25 = buffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish, lVar20 = local_230, iVar33 < iVar11;
          iVar33 = iVar33 + 1) {
        if ((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
             *)buffer.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_finish == p_Var28) {
          sVar24 = (long)p_Var28 - (long)__dest_00;
          if (sVar24 == local_210) {
            buffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)__dest_00;
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          __p = (pointer)((long)sVar24 / 0x14);
          __n = (long)sVar24 % 0x14;
          pDVar19 = __p;
          if (p_Var28 == __dest_00) {
            pDVar19 = (pointer)&DAT_00000001;
          }
          puVar36 = (undefined1 *)((long)&__p->count + (long)&pDVar19->count);
          if ((undefined1 *)0x666666666666665 < puVar36) {
            puVar36 = (undefined1 *)0x666666666666666;
          }
          if (CARRY8((ulong)pDVar19,(ulong)__p)) {
            puVar36 = (undefined1 *)0x666666666666666;
          }
          local_234 = iVar33;
          if (puVar36 == (undefined1 *)0x0) {
            p_Var28 = __dest_00;
            __dest_00 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
                         *)0x0;
          }
          else {
            local_240 = __dest_00;
            __dest_00 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
                         *)operator_new((long)puVar36 * 0x14);
            __n = extraout_RDX;
            p_Var28 = local_240;
            fVar26 = local_244;
          }
          lVar20 = (long)__p * 0x14;
          *(float *)((long)&(__dest_00->_M_impl).super__Vector_impl_data._M_start + lVar20) = fVar26
          ;
          *(undefined4 *)((long)&(__dest_00->_M_impl).super__Vector_impl_data._M_start + lVar20 + 4)
               = 1;
          *(float *)((long)&(__dest_00->_M_impl).super__Vector_impl_data._M_finish + lVar20) =
               SUB84(p_Var21,0);
          *(undefined8 *)
           ((long)&(__dest_00->_M_impl).super__Vector_impl_data._M_finish + lVar20 + 4) = 0;
          local_240 = p_Var21;
          if (0 < (long)sVar24) {
            memmove(__dest_00,p_Var28,sVar24);
            __n = extraout_RDX_00;
          }
          pVVar25 = (pointer)(sVar24 + (long)__dest_00);
          std::
          _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
          ::_M_deallocate(p_Var28,__p,__n);
          p_Var28 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
                     *)((long)&(__dest_00->_M_impl).super__Vector_impl_data._M_start +
                       (long)puVar36 * 0x14);
          p_Var21 = local_240;
          iVar33 = local_234;
          buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var28;
          fVar26 = local_244;
        }
        else {
          (buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->m_data[0] = fVar26;
          (buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->m_data[1] = 1.4013e-45;
          (buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->m_data[2] = SUB84(p_Var21,0);
          *(undefined8 *)
           ((buffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->m_data + 3) = 0;
        }
        buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(pVVar25[1].m_data + 1);
        iVar11 = this->m_numDrawCmds;
        p_Var21 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
                   *)(ulong)(uint)((int)p_Var21 + (int)fVar26);
      }
      buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)__dest_00;
      (**(code **)(local_230 + 0x40))(0x8f3f,this->m_cmdBufferID);
      (**(code **)(lVar20 + 0x150))(0x8f3f,(long)pVVar25 - (long)__dest_00,__dest_00,0x88e4);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
                 *)&buffer);
    }
    else if (this->m_drawMethod == DRAWMETHOD_DRAWARRAYS) {
      buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fVar37 = (float)(iVar33 * 3);
      fVar26 = 0.0;
      ppDVar35 = (pointer *)0x0;
      __dest = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
                *)0x0;
      local_244 = fVar37;
      local_230 = lVar20;
      for (iVar33 = 0;
          pVVar25 = buffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish, lVar20 = local_230, iVar33 < iVar11;
          iVar33 = iVar33 + 1) {
        if (buffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_finish == (pointer)ppDVar35) {
          sVar24 = (long)ppDVar35 - (long)__dest;
          if (sVar24 == 0x7ffffffffffffff0) {
            buffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)__dest;
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          __p_00 = (pointer)((long)sVar24 >> 4);
          pDVar18 = (pointer)&DAT_00000001;
          if ((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
               *)ppDVar35 != __dest) {
            pDVar18 = __p_00;
          }
          puVar36 = (undefined1 *)((long)&__p_00->count + (long)&pDVar18->count);
          if ((undefined1 *)0x7fffffffffffffe < puVar36) {
            puVar36 = (undefined1 *)0x7ffffffffffffff;
          }
          if (CARRY8((ulong)pDVar18,(ulong)__p_00)) {
            puVar36 = (undefined1 *)0x7ffffffffffffff;
          }
          local_234 = iVar33;
          if (puVar36 == (undefined1 *)0x0) {
            p_Var21 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
                       *)__dest;
            __dest = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
                      *)0x0;
          }
          else {
            local_240 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
                         *)__dest;
            __dest = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
                      *)operator_new((long)puVar36 << 4);
            p_Var21 = local_240;
            fVar37 = local_244;
          }
          *(float *)(&(__dest->_M_impl).super__Vector_impl_data._M_start + (long)__p_00 * 2) =
               fVar37;
          *(undefined4 *)
           ((long)&(__dest->_M_impl).super__Vector_impl_data._M_start + (long)__p_00 * 0x10 + 4) = 1
          ;
          *(float *)(&(__dest->_M_impl).super__Vector_impl_data._M_finish + (long)__p_00 * 2) =
               fVar26;
          *(undefined4 *)
           ((long)&(__dest->_M_impl).super__Vector_impl_data._M_finish + (long)__p_00 * 0x10 + 4) =
               0;
          local_240 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
                       *)(ulong)(uint)fVar26;
          if (0 < (long)sVar24) {
            memmove(__dest,p_Var21,sVar24);
            fVar37 = local_244;
          }
          pVVar25 = (pointer)(sVar24 + (long)__dest);
          std::
          _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
          ::_M_deallocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
                           *)p_Var21,__p_00,(size_t)p_Var21);
          ppDVar35 = &(__dest->_M_impl).super__Vector_impl_data._M_start + (long)puVar36 * 2;
          fVar26 = SUB84(local_240,0);
          buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppDVar35;
          iVar33 = local_234;
        }
        else {
          (buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->m_data[0] = fVar37;
          (buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->m_data[1] = 1.4013e-45;
          (buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->m_data[2] = fVar26;
          (buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->m_data[3] = 0.0;
        }
        buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = pVVar25 + 1;
        iVar11 = this->m_numDrawCmds;
        fVar26 = (float)((int)fVar26 + (int)fVar37);
      }
      buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)__dest;
      (**(code **)(local_230 + 0x40))(0x8f3f,this->m_cmdBufferID);
      (**(code **)(lVar20 + 0x150))(0x8f3f,(long)pVVar25 - (long)__dest,__dest,0x88e4);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
                 *)&buffer);
    }
    dVar12 = (**(code **)(lVar20 + 0x800))();
    glu::checkError(dVar12,"create draw command",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x572);
  }
  if (this->m_computeData != false) goto LAB_011db7f3;
  buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppVVar1 = &buffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar1);
  std::operator<<((ostream *)ppVVar1,"Uploading draw data buffer.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar1);
  buffer_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
  buffer_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  buffer_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0x3f800000;
  vaoID = 0;
  uStack_224 = 0x3f800000;
  uStack_220 = 0;
  uStack_21c = 0x3f800000;
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar20 = CONCAT44(extraout_var_01,iVar11);
  if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&buffer,(long)((*value + 1) * (*value + 1) * 4),&local_245);
    iVar11 = *value;
    iVar33 = 0;
    for (iVar27 = 0; iVar27 < iVar11 + 1; iVar27 = iVar27 + 1) {
      uVar14 = (undefined4)((ulong)in_XMM2_Qa >> 0x20);
      in_XMM2_Qa = CONCAT44(uVar14,(float)iVar27);
      iVar22 = 3;
      for (iVar30 = 0; iVar30 < iVar11 + 1; iVar30 = iVar30 + 1) {
        auVar40._4_12_ = in_XMM3._4_12_;
        auVar40._0_4_ = (float)iVar30;
        auVar42._0_8_ = auVar40._0_8_;
        auVar42._8_4_ = in_XMM3._4_4_;
        auVar42._12_4_ = uVar14;
        auVar41._8_8_ = auVar42._8_8_;
        auVar41._4_4_ = (float)iVar27;
        auVar41._0_4_ = auVar40._0_4_;
        auVar48._0_4_ = (float)iVar11;
        auVar48._4_4_ = auVar48._0_4_;
        auVar48._8_4_ = auVar48._0_4_;
        auVar48._12_4_ = auVar48._0_4_;
        auVar47 = divps(auVar41,auVar48);
        uVar38 = CONCAT44(auVar47._4_4_ + auVar47._4_4_ + -1.0,auVar47._0_4_ + auVar47._0_4_ + -1.0)
        ;
        pVVar25 = buffer.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (iVar22 + (iVar11 + 1) * iVar33 + -3);
        *(undefined8 *)pVVar25->m_data = uVar38;
        pVVar25->m_data[2] = 0.0;
        pVVar25->m_data[3] = 1.0;
        auVar47._4_4_ = uStack_224;
        auVar47._0_4_ = vaoID;
        auVar47._8_4_ = uStack_220;
        auVar47._12_4_ = uStack_21c;
        *(undefined1 (*) [16])
         buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_start[(*value + 1) * iVar33 + iVar22 + -2].m_data =
             auVar47;
        pVVar25 = buffer.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + ((*value + 1) * iVar33 + iVar22 + -1);
        *(undefined8 *)pVVar25->m_data = uVar38;
        pVVar25->m_data[2] = 0.0;
        pVVar25->m_data[3] = 1.0;
        in_XMM3._8_4_ =
             (int)buffer_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        in_XMM3._0_8_ =
             buffer_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
        in_XMM3._12_4_ =
             buffer_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish._4_4_;
        *(undefined1 (*) [16])
         buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_start[(*value + 1) * iVar33 + iVar22].m_data = in_XMM3;
        iVar11 = *value;
        iVar22 = iVar22 + 4;
      }
      iVar33 = iVar33 + 4;
    }
    (**(code **)(lVar20 + 0x40))(0x8892,this->m_dataBufferID);
    (**(code **)(lVar20 + 0x150))
              (0x8892,(long)((int)buffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (int)buffer.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
               buffer.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e4);
LAB_011db7bf:
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&buffer.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  }
  else if (this->m_drawMethod == DRAWMETHOD_DRAWARRAYS) {
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&buffer,(long)(*value * *value * 0xc),&local_245);
    iVar11 = *value;
    fVar26 = (float)DAT_016f8e00;
    fVar37 = DAT_016f8e00._4_4_;
    for (iVar33 = 0; iVar33 < iVar11; iVar33 = iVar33 + 1) {
      auVar39._4_12_ = in_XMM3._4_12_;
      auVar39._0_4_ = (float)iVar33;
      for (iVar27 = 0; iVar27 < iVar11; iVar27 = iVar27 + 1) {
        auVar44._4_12_ = in_XMM4._4_12_;
        auVar44._0_4_ = (float)iVar27;
        fVar51 = (float)iVar11;
        auVar46._0_8_ = auVar44._0_8_;
        auVar46._8_4_ = in_XMM4._4_4_;
        auVar46._12_4_ = in_XMM3._4_4_;
        auVar45._8_8_ = auVar46._8_8_;
        auVar45._4_4_ = auVar39._0_4_;
        auVar45._0_4_ = auVar44._0_4_;
        pvVar31 = &buffer_2;
        if ((iVar33 + iVar27 & 1U) == 0) {
          pvVar31 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vaoID;
        }
        auVar4._4_4_ = fVar51;
        auVar4._0_4_ = fVar51;
        auVar4._8_4_ = fVar51;
        auVar4._12_4_ = fVar51;
        auVar47 = divps(auVar45,auVar4);
        fVar43 = auVar47._0_4_ + auVar47._0_4_ + fVar26;
        fVar49 = auVar47._4_4_ + auVar47._4_4_ + fVar37;
        auVar5._8_4_ = 0;
        auVar5._0_8_ = CONCAT44(fVar49,fVar43);
        auVar5._12_4_ = 0x3f800000;
        *(undefined1 (*) [16])
         buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_start[(iVar11 * iVar33 + iVar27) * 0xc].m_data = auVar5;
        uVar32 = (*value * iVar33 + iVar27) * 0xc | 2;
        buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start[(int)uVar32].m_data[1] = fVar49;
        buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start[(int)uVar32].m_data[2] = 0.0;
        buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start[(int)uVar32].m_data[3] = 1.0;
        fVar50 = 2.0 / fVar51 + fVar43;
        fVar51 = 2.0 / fVar51 + fVar49;
        buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start[(int)uVar32].m_data[0] = fVar50;
        pVVar25 = buffer.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + ((*value * iVar33 + iVar27) * 0xc + 4)
        ;
        pVVar25->m_data[0] = fVar50;
        pVVar25->m_data[1] = fVar51;
        pVVar25->m_data[2] = 0.0;
        pVVar25->m_data[3] = 1.0;
        auVar6._8_4_ = 0;
        auVar6._0_8_ = CONCAT44(fVar49,fVar43);
        auVar6._12_4_ = 0x3f800000;
        *(undefined1 (*) [16])
         buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_start[(*value * iVar33 + iVar27) * 0xc + 6].m_data =
             auVar6;
        pVVar25 = buffer.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + ((*value * iVar33 + iVar27) * 0xc + 8)
        ;
        pVVar25->m_data[0] = fVar50;
        pVVar25->m_data[1] = fVar51;
        pVVar25->m_data[2] = 0.0;
        pVVar25->m_data[3] = 1.0;
        iVar11 = (*value * iVar33 + iVar27) * 0xc + 10;
        buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start[iVar11].m_data[0] = fVar43;
        buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start[iVar11].m_data[1] = fVar51;
        buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start[iVar11].m_data[2] = 0.0;
        buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start[iVar11].m_data[3] = 1.0;
        iVar11 = *value;
        puVar8 = (pvVar31->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        *(pointer *)
         buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_start[(iVar11 * iVar33 + iVar27) * 0xc + 1].m_data =
             (pvVar31->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         (buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start[(iVar11 * iVar33 + iVar27) * 0xc + 1].m_data + 2)
             = puVar8;
        iVar11 = *value;
        puVar8 = (pvVar31->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        *(pointer *)
         buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_start[(int)((iVar11 * iVar33 + iVar27) * 0xc | 3)].
         m_data = (pvVar31->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        *(pointer *)
         (buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start[(int)((iVar11 * iVar33 + iVar27) * 0xc | 3)].
          m_data + 2) = puVar8;
        iVar11 = *value;
        puVar8 = (pvVar31->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        *(pointer *)
         buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_start[(iVar11 * iVar33 + iVar27) * 0xc + 5].m_data =
             (pvVar31->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         (buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start[(iVar11 * iVar33 + iVar27) * 0xc + 5].m_data + 2)
             = puVar8;
        iVar11 = *value;
        puVar8 = (pvVar31->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        *(pointer *)
         buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_start[(iVar11 * iVar33 + iVar27) * 0xc + 7].m_data =
             (pvVar31->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         (buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start[(iVar11 * iVar33 + iVar27) * 0xc + 7].m_data + 2)
             = puVar8;
        iVar11 = *value;
        puVar8 = (pvVar31->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        *(pointer *)
         buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_start[(iVar11 * iVar33 + iVar27) * 0xc + 9].m_data =
             (pvVar31->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         (buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start[(iVar11 * iVar33 + iVar27) * 0xc + 9].m_data + 2)
             = puVar8;
        in_XMM4._0_8_ =
             (pvVar31->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
        in_XMM4._8_8_ =
             (pvVar31->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        *(undefined1 (*) [16])
         buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_start[(*value * iVar33 + iVar27) * 0xc + 0xb].m_data =
             in_XMM4;
        iVar11 = *value;
      }
      in_XMM3 = auVar39;
    }
    (**(code **)(lVar20 + 0x40))(0x8892,this->m_dataBufferID);
    (**(code **)(lVar20 + 0x150))
              (0x8892,(long)((int)buffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (int)buffer.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
               buffer.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e4);
    goto LAB_011db7bf;
  }
  dVar12 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar12,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x5b6);
LAB_011db7f3:
  if ((this->m_computeIndices == false) && (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS)) {
    buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppVVar1 = &buffer.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar1);
    std::operator<<((ostream *)ppVVar1,"Uploading draw index buffer.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar1);
    iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar20 = CONCAT44(extraout_var_02,iVar11);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&buffer_2,(long)(*value * *value * 6),(allocator_type *)&vaoID);
    iVar11 = *value;
    iVar27 = 0;
    iVar30 = 2;
    iVar33 = 0;
    while (iVar33 < iVar11) {
      iVar34 = 0;
      for (iVar22 = 0; iVar22 < iVar11; iVar22 = iVar22 + 1) {
        iVar7 = (iVar33 + iVar22) % 2;
        iVar13 = iVar34 + iVar7;
        buffer_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[(iVar11 * iVar33 + iVar22) * 6] =
             (iVar11 + 1) * iVar27 + iVar13;
        buffer_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[(*value * iVar33 + iVar22) * 6 + 1] =
             (*value + 1) * iVar30 + iVar13;
        buffer_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[(*value * iVar33 + iVar22) * 6 + 2] =
             iVar34 + (*value + 1) * iVar30 + iVar7 + 2;
        buffer_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[(*value * iVar33 + iVar22) * 6 + 3] =
             (*value + 1) * iVar27 + iVar13;
        buffer_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[(*value * iVar33 + iVar22) * 6 + 4] =
             iVar34 + (*value + 1) * iVar30 + iVar7 + 2;
        buffer_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[(*value * iVar33 + iVar22) * 6 + 5] =
             iVar34 + (*value + 1) * iVar27 + iVar7 + 2;
        iVar11 = *value;
        iVar34 = iVar34 + 2;
      }
      iVar27 = iVar27 + 2;
      iVar30 = iVar30 + 2;
      iVar33 = iVar33 + 1;
    }
    (**(code **)(lVar20 + 0x40))(0x8893,this->m_indexBufferID);
    (**(code **)(lVar20 + 0x150))
              (0x8893,(long)((int)buffer_2.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (int)buffer_2.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffffc,
               buffer_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
    dVar12 = (**(code **)(lVar20 + 0x800))();
    glu::checkError(dVar12,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x5d1);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&buffer_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppVVar1 = &buffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar1);
  std::operator<<((ostream *)ppVVar1,"Filling following buffers using compute shader:\n");
  pcVar29 = "\tcommand buffer\n";
  pcVar23 = glcts::fixed_sample_locations_values + 1;
  if (this->m_computeCmd == false) {
    pcVar29 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)ppVVar1,pcVar29);
  pcVar29 = "\tdata buffer\n";
  if (this->m_computeData == false) {
    pcVar29 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)ppVVar1,pcVar29);
  if (this->m_computeIndices != false) {
    pcVar23 = "\tindex buffer\n";
  }
  std::operator<<((ostream *)ppVVar1,pcVar23);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar1);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  bVar9 = this->m_computeCmd;
  bVar2 = this->m_computeData;
  bVar3 = this->m_computeIndices;
  buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppVVar1 = &buffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar1);
  std::operator<<((ostream *)ppVVar1,"Memory barrier. Barriers = ");
  iVar11 = ((uint)bVar9 << 6 | (uint)bVar2) + (uint)bVar3 * 2;
  glu::getMemoryBarrierFlagsStr((Bitfield<16UL> *)&buffer_2,iVar11);
  pMVar17 = tcu::MessageBuilder::operator<<((MessageBuilder *)&buffer,(Bitfield<16UL> *)&buffer_2);
  tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar1);
  (**(code **)(CONCAT44(extraout_var,iVar10) + 0xdb8))(iVar11);
  buffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppVVar1 = &buffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppVVar1);
  std::operator<<((ostream *)ppVVar1,"Drawing from buffers with ");
  pMVar17 = tcu::MessageBuilder::operator<<((MessageBuilder *)&buffer,&this->m_numDrawCmds);
  std::operator<<(&(pMVar17->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " draw call(s).");
  tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppVVar1);
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar20 = CONCAT44(extraout_var_03,iVar11);
  uVar14 = (**(code **)(lVar20 + 0x780))((this->m_shaderProgram->m_program).m_program,"a_position");
  uVar15 = (**(code **)(lVar20 + 0x780))((this->m_shaderProgram->m_program).m_program,"a_color");
  vaoID = 0;
  (**(code **)(lVar20 + 0x708))(1);
  (**(code **)(lVar20 + 0xd8))(vaoID);
  (**(code **)(lVar20 + 0x40))(0x8892,this->m_dataBufferID);
  (**(code **)(lVar20 + 0x19f0))(uVar14,4,0x1406,0,0x20,0);
  (**(code **)(lVar20 + 0x19f0))(uVar15,4,0x1406,0,0x20,0x10);
  (**(code **)(lVar20 + 0x610))(uVar14);
  (**(code **)(lVar20 + 0x610))(uVar15);
  if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
    (**(code **)(lVar20 + 0x40))(0x8893,this->m_indexBufferID);
  }
  (**(code **)(lVar20 + 0x40))(0x8f3f,this->m_cmdBufferID);
  (**(code **)(lVar20 + 0x1c0))(0,0,0);
  (**(code **)(lVar20 + 0x188))(0x4000);
  (**(code **)(lVar20 + 0x1a00))(0,0,surface.m_width,surface.m_height);
  (**(code **)(lVar20 + 0x1680))((this->m_shaderProgram->m_program).m_program);
  for (iVar11 = 0; iVar11 < this->m_numDrawCmds; iVar11 = iVar11 + 1) {
    if (this->m_drawMethod == DRAWMETHOD_DRAWARRAYS) {
      (**(code **)(lVar20 + 0x540))(4,this->m_commandSize * iVar11);
    }
    else if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
      (**(code **)(lVar20 + 0x578))(4,0x1405);
    }
  }
  (**(code **)(lVar20 + 0x1680))(0);
  (**(code **)(lVar20 + 0x490))(1,&vaoID);
  dVar12 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar12,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x605);
  (**(code **)(lVar20 + 0x648))();
  dVar12 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar12,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x608);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&buffer_2,&surface);
  glu::readPixels(context,0,0,(PixelBufferAccess *)&buffer_2);
  dVar12 = (**(code **)(lVar20 + 0x800))();
  glu::checkError(dVar12,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x60b);
  bVar9 = verifyImageYellowGreen
                    (&surface,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                              m_log);
  pcVar23 = "Result image invalid";
  if (bVar9) {
    pcVar23 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar9,pcVar23);
  tcu::Surface::~Surface(&surface);
  return STOP;
}

Assistant:

ComputeShaderGeneratedCase::IterateResult ComputeShaderGeneratedCase::iterate (void)
{
	const int				renderTargetWidth	= de::min(1024, m_context.getRenderTarget().getWidth());
	const int				renderTargetHeight	= de::min(1024, m_context.getRenderTarget().getHeight());
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	tcu::Surface			surface				(renderTargetWidth, renderTargetHeight);

	m_testCtx.getLog() << tcu::TestLog::Message << "Preparing to draw " << m_gridSize << " x " << m_gridSize << " grid." << tcu::TestLog::EndMessage;

	try
	{
		// Gen command buffer
		if (!m_computeCmd)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Uploading draw command buffer." << tcu::TestLog::EndMessage;
			createDrawCommand();
		}

		// Gen data buffer
		if (!m_computeData)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Uploading draw data buffer." << tcu::TestLog::EndMessage;
			createDrawData();
		}

		// Gen index buffer
		if (!m_computeIndices && m_drawMethod == DRAWMETHOD_DRAWELEMENTS)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Uploading draw index buffer." << tcu::TestLog::EndMessage;
			createDrawIndices();
		}

		// Run compute shader
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message << "Filling following buffers using compute shader:\n"
				<< ((m_computeCmd)		? ("\tcommand buffer\n")	: (""))
				<< ((m_computeData)		? ("\tdata buffer\n")		: (""))
				<< ((m_computeIndices)	? ("\tindex buffer\n")		: (""))
				<< tcu::TestLog::EndMessage;
			runComputeShader();
		}

		// Ensure data is written to the buffers before we try to read it
		{
			const glw::GLuint barriers = ((m_computeCmd)     ? (GL_COMMAND_BARRIER_BIT)             : (0)) |
										 ((m_computeData)    ? (GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT) : (0)) |
										 ((m_computeIndices) ? (GL_ELEMENT_ARRAY_BARRIER_BIT)       : (0));

			m_testCtx.getLog() << tcu::TestLog::Message << "Memory barrier. Barriers = " << glu::getMemoryBarrierFlagsStr(barriers) << tcu::TestLog::EndMessage;
			gl.memoryBarrier(barriers);
		}

		// Draw from buffers

		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing from buffers with " << m_numDrawCmds << " draw call(s)." << tcu::TestLog::EndMessage;
		renderTo(surface);
	}
	catch (glu::OutOfMemoryError&)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Got GL_OUT_OF_MEMORY." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Got GL_OUT_OF_MEMORY");
		m_testCtx.setTerminateAfter(true); // Do not rely on implementation to be able to recover from OOM
		return STOP;
	}


	// verify image
	// \note the green/yellow pattern is only for clarity. The test will only verify that all grid cells were drawn by looking for anything non-green/yellow.
	if (verifyImageYellowGreen(surface, m_testCtx.getLog()))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result image invalid");
	return STOP;
}